

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O0

bool __thiscall ON_BrepFace::Read(ON_BrepFace *this,ON_BinaryArchive *file)

{
  bool local_1d;
  uint local_1c;
  bool rc;
  ON_BinaryArchive *pOStack_18;
  int i;
  ON_BinaryArchive *file_local;
  ON_BrepFace *this_local;
  
  pOStack_18 = file;
  file_local = (ON_BinaryArchive *)this;
  local_1d = ON_BinaryArchive::ReadInt(file,&this->m_face_index);
  if (local_1d) {
    local_1d = ON_BinaryArchive::ReadArray(pOStack_18,&this->m_li);
  }
  if (local_1d != false) {
    local_1d = ON_BinaryArchive::ReadInt(pOStack_18,&this->m_si);
  }
  if (local_1d != false) {
    local_1c = (uint)(this->m_bRev & 1);
    local_1d = ON_BinaryArchive::ReadInt(pOStack_18,(ON__INT32 *)&local_1c);
    if (local_1d) {
      this->m_bRev = local_1c != 0;
    }
  }
  if ((local_1d != false) &&
     (local_1d = ON_BinaryArchive::ReadInt(pOStack_18,&this->m_face_material_channel),
     this->m_face_material_channel < 0)) {
    this->m_face_material_channel = 0;
  }
  return local_1d;
}

Assistant:

bool ON_BrepFace::Read( ON_BinaryArchive& file )
{
  int i;
  bool rc = file.ReadInt( &m_face_index );
  if ( rc )
    rc = file.ReadArray( m_li );
  if ( rc )
    rc = file.ReadInt( &m_si );
  if ( rc )
  {
    i = m_bRev;
    rc = file.ReadInt( &i );
    if ( rc )
      m_bRev = (i!=0);
  }
  if ( rc )
  {
    rc = file.ReadInt( &m_face_material_channel );
    if ( m_face_material_channel < 0 )
      m_face_material_channel = 0;
  }
  return rc;
}